

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_Material * __thiscall
ON_RenderMaterial::ToOnMaterial(ON_Material *__return_storage_ptr__,ON_RenderMaterial *this)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar4;
  ON_XMLNode *node;
  wchar_t *pwVar5;
  long lVar6;
  ON_XMLVariant *pOVar7;
  ON_Xform *pOVar8;
  byte bVar9;
  double dVar10;
  ON_4fColor OVar11;
  ON_XMLParameters p;
  ON_wString s;
  uint local_3c0;
  BRDFs brdf;
  pthread_mutex_t *local_3b8;
  ON_Texture tex;
  shared_ptr<ON_PhysicallyBasedMaterial> pbm;
  float local_b0 [8] [4];
  
  bVar9 = 0;
  local_3b8 = (pthread_mutex_t *)&((this->super_ON_RenderContent)._private)->m_mutex;
  std::recursive_mutex::lock((recursive_mutex *)&local_3b8->__data);
  ON_Material::ON_Material(__return_storage_ptr__);
  node = ON_RenderContentPrivate::XMLNode_Simulation((this->super_ON_RenderContent)._private);
  if (node != (ON_XMLNode *)0x0) {
    ON_XMLParameters::ON_XMLParameters(&p,node);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"ambient");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_ambient).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"diffuse");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_diffuse).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"emission");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_emission).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"specular");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_specular).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"shine");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_shine = dVar10 * 255.0;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"reflection");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_reflection).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"reflectivity");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_reflectivity = dVar10;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"transparency");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_transparency = dVar10;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"transparent");
    pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>)
         ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&pbm);
    (__return_storage_ptr__->m_transparent).field_0 = aVar4;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"ior");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_index_of_refraction = dVar10;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"polish-amount");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_reflection_glossiness = 1.0 - dVar10;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"clarity-amount");
    dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_refraction_glossiness = 1.0 - dVar10;
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"fresnel-enabled");
    bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&tex);
    ON_Material::SetFresnelReflections(__return_storage_ptr__,bVar2);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    ParamHelper((ON_XMLVariant *)&tex,&p,L"disable-lighting");
    bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&tex);
    ON_Material::SetDisableLighting(__return_storage_ptr__,bVar2);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    __return_storage_ptr__->m_fresnel_index_of_refraction = 1.56;
    ParamHelper((ON_XMLVariant *)&tex,&p,L"is-physically-based");
    bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&tex);
    ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
    if (bVar2) {
      ON_Material::ToPhysicallyBased(__return_storage_ptr__);
      ON_Material::PhysicallyBased((ON_Material *)&pbm);
      brdf = GGX;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-brdf");
      ::ON_XMLVariant::AsString((ON_XMLVariant *)&s);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      bVar2 = ::operator==(&s,L"ward");
      if (bVar2) {
        brdf = Ward;
      }
      (*(pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ON_PhysicallyBasedMaterial[4])
                (pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&brdf);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-base-color");
      local_b0[0] = (float  [4])::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[6])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-subsurface");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[8])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-subsurface-scattering-color");
      local_b0[0] = (float  [4])::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[10])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-subsurface-scattering-radius");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0xc])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-specular");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x10])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-specular-tint");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x14])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-metallic");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0xe])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-roughness");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x16])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-anisotropic");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x18])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-anisotropic-rotation");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x1a])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-sheen");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x1c])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-sheen-tint");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x1e])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-clearcoat");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x20])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-clearcoat-roughness");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x22])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-opacity");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x26])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-opacity-ior");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x24])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-opacity-roughness");
      ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x28])(peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-emission");
      OVar11 = ::ON_XMLVariant::AsColor((ON_XMLVariant *)&tex);
      (*peVar1->_vptr_ON_PhysicallyBasedMaterial[0x2a])
                (OVar11.m_color._0_8_,OVar11.m_color._8_8_,peVar1);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-alpha");
      dVar10 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&tex);
      ON_PhysicallyBasedMaterial::SetAlpha(peVar1,dVar10);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      peVar1 = pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ParamHelper((ON_XMLVariant *)&tex,&p,L"pbr-use-base-color-texture-alpha");
      bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&tex);
      ON_PhysicallyBasedMaterial::SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture
                (peVar1,bVar2);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&tex);
      ON_wString::~ON_wString(&s);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ON_ModelComponent::Name((ON_ModelComponent *)&tex);
    pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&tex);
    ON_ModelComponent::SetName(&__return_storage_ptr__->super_ON_ModelComponent,pwVar5);
    ON_wString::~ON_wString((ON_wString *)&tex);
    ON_ClassArray<ON_Texture>::Destroy
              (&(__return_storage_ptr__->m_textures).super_ON_ClassArray<ON_Texture>);
    local_3c0 = 1;
    do {
      ON_Texture::ON_Texture(&tex);
      ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&pbm);
      ON_wString::ON_wString(&s);
      ON_wString::Format(&s,L"Texture-%u-",(ulong)local_3c0);
      ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
      pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
      bVar2 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
      ON_wString::~ON_wString((ON_wString *)local_b0);
      if (bVar2) {
        ::ON_XMLVariant::AsString((ON_XMLVariant *)local_b0);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        ON_FileReference::SetFullPath(&tex.m_image_file_reference,pwVar5,false);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_bOn = ::ON_XMLVariant::operator_cast_to_bool((ON_XMLVariant *)&pbm);
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_blend_constant_A = ::ON_XMLVariant::operator_cast_to_double((ON_XMLVariant *)&pbm);
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_type = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&pbm);
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_minfilter = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&pbm);
          tex.m_magfilter = tex.m_minfilter;
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_mode = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&pbm);
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          ::ON_XMLVariant::AsXform((ON_Xform *)local_b0,(ON_XMLVariant *)&pbm);
          pOVar7 = (ON_XMLVariant *)local_b0;
          pOVar8 = &tex.m_uvw;
          for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
            pOVar8->m_xform[0][0] = (double)pOVar7->_vptr_ON_XMLVariant;
            pOVar7 = (ON_XMLVariant *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
            pOVar8 = (ON_Xform *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
          }
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_wrapu = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&pbm);
        }
        ON_wString::operator+((ON_wString *)local_b0,(wchar_t *)&s);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_b0);
        bVar3 = ON_XMLParameters::GetParam(&p,pwVar5,(ON_XMLVariant *)&pbm);
        ON_wString::~ON_wString((ON_wString *)local_b0);
        if (bVar3) {
          tex.m_wrapv = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&pbm);
        }
        ON_ClassArray<ON_Texture>::Append
                  (&(__return_storage_ptr__->m_textures).super_ON_ClassArray<ON_Texture>,&tex);
        local_3c0 = local_3c0 + 1;
      }
      ON_wString::~ON_wString(&s);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&pbm);
      ON_Texture::~ON_Texture(&tex);
    } while (bVar2);
    ON_XMLParameters::~ON_XMLParameters(&p);
  }
  pthread_mutex_unlock(local_3b8);
  return __return_storage_ptr__;
}

Assistant:

ON_Material ON_RenderMaterial::ToOnMaterial(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_Material mat;

  const ON_XMLNode* sim_node = _private->XMLNode_Simulation();
  if (nullptr != sim_node)
  {
    ON_XMLParameters p(*sim_node);

    mat.m_ambient               =       ParamHelper(p, ON_MATERIAL_AMBIENT              ).AsColor();
    mat.m_diffuse               =       ParamHelper(p, ON_MATERIAL_DIFFUSE              ).AsColor();
    mat.m_emission              =       ParamHelper(p, ON_MATERIAL_EMISSION             ).AsColor();
    mat.m_specular              =       ParamHelper(p, ON_MATERIAL_SPECULAR             ).AsColor();
    mat.m_shine                 =       ParamHelper(p, ON_MATERIAL_SHINE                ).AsDouble() * ON_Material::MaxShine;
    mat.m_reflection            =       ParamHelper(p, ON_MATERIAL_SIM_REFLECTION_COLOR ).AsColor();
    mat.m_reflectivity          =       ParamHelper(p, ON_MATERIAL_REFLECTIVITY_AMOUNT  ).AsDouble();
    mat.m_transparency          =       ParamHelper(p, ON_MATERIAL_TRANSPARENCY_AMOUNT  ).AsDouble();
    mat.m_transparent           =       ParamHelper(p, ON_MATERIAL_SIM_TRANSPARENT_COLOR).AsColor();
    mat.m_index_of_refraction   =       ParamHelper(p, ON_MATERIAL_IOR                  ).AsDouble();
    mat.m_reflection_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_POLISH_AMOUNT        ).AsDouble();
    mat.m_refraction_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_CLARITY_AMOUNT       ).AsDouble();
    mat.SetFresnelReflections   (       ParamHelper(p, ON_MATERIAL_FRESNEL_ENABLED      ).AsBool());
    mat.SetDisableLighting      (       ParamHelper(p, ON_MATERIAL_DISABLE_LIGHTING     ).AsBool());

    mat.m_fresnel_index_of_refraction = 1.56;

    if (ParamHelper(p, ON_MATERIAL_IS_PHYSICALLY_BASED).AsBool())
    {
      mat.ToPhysicallyBased();

      auto pbm = mat.PhysicallyBased();

      auto brdf = ON_PhysicallyBasedMaterial::BRDFs::GGX;
      const ON_wString s = ParamHelper(p, ON_PBR_MATERIAL_BRDF).AsString();
      if (s == ON_PBR_MATERIAL_BRDF_WARD)
        brdf = ON_PhysicallyBasedMaterial::BRDFs::Ward;
      pbm->SetBRDF(brdf);

      pbm->SetBaseColor                 (ParamHelper(p, ON_PBR_MATERIAL_BASE_COLOR).AsColor());
      pbm->SetSubsurface                (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE).AsDouble());
      pbm->SetSubsurfaceScatteringColor (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_COLOR).AsColor());
      pbm->SetSubsurfaceScatteringRadius(ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_RADIUS).AsDouble());
      pbm->SetSpecular                  (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR).AsDouble());
      pbm->SetSpecularTint              (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR_TINT).AsDouble());
      pbm->SetMetallic                  (ParamHelper(p, ON_PBR_MATERIAL_METALLIC).AsDouble());
      pbm->SetRoughness                 (ParamHelper(p, ON_PBR_MATERIAL_ROUGHNESS).AsDouble());
      pbm->SetAnisotropic               (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC).AsDouble());
      pbm->SetAnisotropicRotation       (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC_ROTATION).AsDouble());
      pbm->SetSheen                     (ParamHelper(p, ON_PBR_MATERIAL_SHEEN).AsDouble());
      pbm->SetSheenTint                 (ParamHelper(p, ON_PBR_MATERIAL_SHEEN_TINT).AsDouble());
      pbm->SetClearcoat                 (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT).AsDouble());
      pbm->SetClearcoatRoughness        (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT_ROUGHNESS).AsDouble());
      pbm->SetOpacity                   (ParamHelper(p, ON_PBR_MATERIAL_OPACITY).AsDouble());
      pbm->SetOpacityIOR                (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_IOR).AsDouble());
      pbm->SetOpacityRoughness          (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_ROUGHNESS).AsDouble());
      pbm->SetEmission                  (ParamHelper(p, ON_PBR_MATERIAL_EMISSION_COLOR).AsColor());
      pbm->SetAlpha                     (ParamHelper(p, ON_PBR_MATERIAL_ALPHA).AsDouble());
      pbm->SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture(ParamHelper(p, ON_PBR_MATERIAL_USE_BASE_COLOR_TEXTURE_ALPHA).AsBool());
    }

    mat.SetName(Name());

    mat.m_textures.Destroy();

    // Iterate over the children.
    int count = 1;
    while (true)
    {
      ON_Texture tex;
      ON_XMLVariant v;

      ON_wString s;
      s.Format(ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FORMAT, count);

      if (!p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILENAME, v))
        break; // Not ideal.

      tex.m_image_file_reference.SetFullPath(v.AsString(), false);

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_ON, v))
        tex.m_bOn = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_AMOUNT, v))
        tex.m_blend_constant_A = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_TYPE, v))
        tex.m_type = ON_Texture::TYPE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILTER, v))
        tex.m_minfilter = tex.m_magfilter = ON_Texture::FILTER(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_MODE, v))
        tex.m_mode = ON_Texture::MODE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_UVW, v))
        tex.m_uvw = v.AsXform();

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_U, v))
        tex.m_wrapu = ON_Texture::WRAP(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_V, v))
        tex.m_wrapv = ON_Texture::WRAP(v.AsInteger());

      mat.m_textures.Append(tex);
      count++;
    }
  }

  return mat;
}